

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O3

void quad_lookup_fill_distance(quad_lookup_t quads,distance_t *distances)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  distance_quad_key_t *pdVar5;
  long in_stack_00000010;
  uint in_stack_00000018;
  byte in_stack_0000001c;
  
  if ((distance_quad_key_t *)0x1 < quads.keys) {
    pdVar5 = (distance_quad_key_t *)0x1;
    uVar4 = 2;
    do {
      uVar1 = *(uint *)(in_stack_00000010 + (long)pdVar5 * 4);
      uVar2 = uVar1 >> (in_stack_0000001c & 0x1f);
      uVar3 = uVar2 >> (in_stack_0000001c & 0x1f);
      *(ulong *)(quads.outputs + (long)pdVar5 * 2) =
           (ulong)distances[in_stack_00000018 & uVar1] |
           (ulong)distances[uVar3 & in_stack_00000018] << 0x20 |
           (ulong)distances[uVar3 >> (in_stack_0000001c & 0x1f)] << 0x30 |
           (long)(int)((uint)distances[uVar2 & in_stack_00000018] << 0x10);
      pdVar5 = (distance_quad_key_t *)(ulong)uVar4;
      uVar4 = uVar4 + 1;
    } while (pdVar5 < quads.keys);
  }
  return;
}

Assistant:

void quad_lookup_fill_distance(quad_lookup_t quads, distance_t *distances) {
    for (unsigned int i = 1; i < quads.outputs_len; i += 1) {
        output_quad_t concat_out = quads.outputs[i];
        unsigned int i_0 = concat_out & quads.output_mask;
        concat_out >>= quads.output_width;
        unsigned int i_1 = concat_out & quads.output_mask;
        concat_out >>= quads.output_width;
        unsigned int i_2 = concat_out & quads.output_mask;
        concat_out >>= quads.output_width;
        unsigned int i_3 = concat_out;

        quads.distances[i] = ((uint64_t)distances[i_3] << 48) | ((uint64_t)distances[i_2] << 32) | (distances[i_1] << 16) | distances[i_0];
    }
}